

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pDVar4;
  _Self *this;
  size_type sVar5;
  DictKey *pDVar6;
  cake_iterator<false> *this_00;
  DictKey local_e58;
  DictKey local_e30;
  undefined1 local_e08 [8];
  iterator iter;
  DictKey local_dc8;
  _Rb_tree_const_iterator<DictKey> local_da0;
  iterator it;
  DictKey e_1;
  iterator __end1_1;
  iterator __begin1_1;
  multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *__range1_1;
  allocator local_d49;
  string local_d48 [32];
  DictKey local_d28;
  _Base_ptr local_d00;
  allocator local_cf1;
  string local_cf0 [32];
  DictKey local_cd0;
  _Base_ptr local_ca8;
  allocator local_c99;
  string local_c98 [32];
  DictKey local_c78;
  _Base_ptr local_c50;
  allocator local_c41;
  string local_c40 [32];
  DictKey local_c20;
  undefined1 local_bf8 [8];
  multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> lolz;
  DictKey e;
  iterator __end1;
  iterator __begin1;
  skiplist<DictKey,_std::less<DictKey>_> *__range1;
  string local_b60 [32];
  DictKey local_b40;
  allocator local_b11;
  string local_b10 [32];
  DictKey local_af0;
  allocator local_ac1;
  string local_ac0 [32];
  DictKey local_aa0;
  allocator local_a61;
  string local_a60 [32];
  DictKey local_a40;
  undefined1 local_a18 [8];
  skiplist<DictKey,_std::less<DictKey>_> aDict;
  
  aDict._2564_4_ = 0;
  skiplist<DictKey,_std::less<DictKey>_>::skiplist
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a60,"hello",&local_a61);
  DictKey::DictKey(&local_a40,10,(string *)local_a60);
  skiplist<DictKey,_std::less<DictKey>_>::insert
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_a40);
  DictKey::~DictKey(&local_a40);
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"jello",&local_ac1);
  DictKey::DictKey(&local_aa0,0x14,(string *)local_ac0);
  skiplist<DictKey,_std::less<DictKey>_>::insert
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_aa0);
  DictKey::~DictKey(&local_aa0);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b10,"yello",&local_b11);
  DictKey::DictKey(&local_af0,0x14,(string *)local_b10);
  skiplist<DictKey,_std::less<DictKey>_>::insert
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_af0);
  DictKey::~DictKey(&local_af0);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"fello",(allocator *)((long)&__range1 + 7));
  DictKey::DictKey(&local_b40,0x28,(string *)local_b60);
  skiplist<DictKey,_std::less<DictKey>_>::insert
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_b40);
  DictKey::~DictKey(&local_b40);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  operator<<((ostream *)&std::cout,(skiplist<DictKey,_std::less<DictKey>_> *)local_a18);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<DictKey,_std::less<DictKey>_>::begin
            ((iterator *)&__end1.node,(skiplist<DictKey,_std::less<DictKey>_> *)local_a18);
  skiplist<DictKey,_std::less<DictKey>_>::end
            ((iterator *)&e.field_0x20,(skiplist<DictKey,_std::less<DictKey>_> *)local_a18);
  while( true ) {
    bVar1 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator!=
                      ((cake_iterator<false> *)&__end1.node,(cake_iterator<false> *)&e.field_0x20);
    if (!bVar1) break;
    pDVar6 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator*
                       ((cake_iterator<false> *)&__end1.node);
    DictKey::DictKey((DictKey *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count,pDVar6);
    poVar3 = operator<<((ostream *)&std::cout,
                        (DictKey *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator<<(poVar3,"\n");
    DictKey::~DictKey((DictKey *)&lolz._M_t._M_impl.super__Rb_tree_header._M_node_count);
    skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator++
              ((cake_iterator<false> *)&__end1.node);
  }
  std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::multiset
            ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"hello",&local_c41);
  DictKey::DictKey(&local_c20,10,(string *)local_c40);
  local_c50 = (_Base_ptr)
              std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::insert
                        ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)
                         local_bf8,&local_c20);
  DictKey::~DictKey(&local_c20);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,"jello",&local_c99);
  DictKey::DictKey(&local_c78,0x14,(string *)local_c98);
  local_ca8 = (_Base_ptr)
              std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::insert
                        ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)
                         local_bf8,&local_c78);
  DictKey::~DictKey(&local_c78);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"yello",&local_cf1);
  DictKey::DictKey(&local_cd0,0x14,(string *)local_cf0);
  local_d00 = (_Base_ptr)
              std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::insert
                        ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)
                         local_bf8,&local_cd0);
  DictKey::~DictKey(&local_cd0);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d48,"fello",&local_d49);
  DictKey::DictKey(&local_d28,0x28,(string *)local_d48);
  std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::insert
            ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8,&local_d28
            );
  DictKey::~DictKey(&local_d28);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  __end1_1 = std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::begin
                       ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8
                       );
  e_1._32_8_ = std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::end
                         ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)
                          local_bf8);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&e_1.field_0x20);
    if (!bVar1) break;
    pDVar4 = std::_Rb_tree_const_iterator<DictKey>::operator*(&__end1_1);
    DictKey::DictKey((DictKey *)&it,pDVar4);
    poVar3 = operator<<((ostream *)&std::cout,(DictKey *)&it);
    std::operator<<(poVar3,"\n");
    DictKey::~DictKey((DictKey *)&it);
    std::_Rb_tree_const_iterator<DictKey>::operator++(&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  DictKey::DictKey(&local_dc8,0x14);
  local_da0._M_node =
       (_Base_ptr)
       std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::find
                 ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8,
                  &local_dc8);
  DictKey::~DictKey(&local_dc8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Found: ");
  pDVar4 = std::_Rb_tree_const_iterator<DictKey>::operator*(&local_da0);
  poVar3 = operator<<(poVar3,pDVar4);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Next: ");
  this = std::_Rb_tree_const_iterator<DictKey>::operator++(&local_da0);
  pDVar4 = std::_Rb_tree_const_iterator<DictKey>::operator*(this);
  poVar3 = operator<<(poVar3,pDVar4);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Count: ");
  DictKey::DictKey((DictKey *)&iter.node,0x14);
  sVar5 = std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::count
                    ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8,
                     (key_type *)&iter.node);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3,"\n");
  DictKey::~DictKey((DictKey *)&iter.node);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  DictKey::DictKey(&local_e30,0x14);
  skiplist<DictKey,_std::less<DictKey>_>::find
            ((iterator *)local_e08,(skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_e30);
  DictKey::~DictKey(&local_e30);
  poVar3 = std::operator<<((ostream *)&std::cout,"Found: ");
  pDVar6 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator*
                     ((cake_iterator<false> *)local_e08);
  poVar3 = operator<<(poVar3,pDVar6);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Next: ");
  this_00 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator++
                      ((cake_iterator<false> *)local_e08);
  pDVar6 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator*(this_00);
  poVar3 = operator<<(poVar3,pDVar6);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Count: ");
  DictKey::DictKey(&local_e58,0x14);
  iVar2 = skiplist<DictKey,_std::less<DictKey>_>::count
                    ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18,&local_e58);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  DictKey::~DictKey(&local_e58);
  aDict._2564_4_ = 0;
  std::multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_>::~multiset
            ((multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> *)local_bf8);
  skiplist<DictKey,_std::less<DictKey>_>::~skiplist
            ((skiplist<DictKey,_std::less<DictKey>_> *)local_a18);
  return aDict._2564_4_;
}

Assistant:

int main() {
  skiplist<DictKey> aDict;

  aDict.insert({10, "hello"});
  aDict.insert({20, "jello"});
  aDict.insert({20, "yello"});
  aDict.insert({40, "fello"});

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multiset<DictKey> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << *it << "\n";
  std::cout << "Next: " << *++it << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}